

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall OpenMD::SquareMatrix<double,_6>::SquareMatrix(SquareMatrix<double,_6> *this)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  
  RectMatrix<double,_6U,_6U>::RectMatrix(&this->super_RectMatrix<double,_6U,_6U>);
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      ((RectMatrix<double,_6U,_6U> *)*(double (*) [6])this)->data_[0][lVar2] = 0.0;
    }
    this = (SquareMatrix<double,_6> *)((long)this + 0x30);
  }
  return;
}

Assistant:

SquareMatrix() {
      for (unsigned int i = 0; i < Dim; i++)
        for (unsigned int j = 0; j < Dim; j++)
          this->data_[i][j] = 0.0;
    }